

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedAtomicOperations
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  bool bVar1;
  
  if (format - 0x8235U < 2) {
    std::operator<<((ostream *)
                    &(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.field_0x88,"Atomic Operations - ");
    bVar1 = verifyAtomicOperations(this,gl,target,format,texture,level);
    return bVar1;
  }
  return true;
}

Assistant:

bool UncommittedRegionsAccessTestCase::UncommittedAtomicOperations(const Functions& gl, GLint target, GLint format,
																   GLuint& texture, GLint level)
{
	bool result = true;

	if (atomicAllowed(target, format))
	{
		mLog << "Atomic Operations - ";
		result = result && verifyAtomicOperations(gl, target, format, texture, level);
	}

	return result;
}